

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

void ZSTD_CCtxParams_init_internal
               (ZSTD_CCtx_params *cctxParams,ZSTD_parameters *params,int compressionLevel)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  ZSTD_compressionParameters cParams;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  ZSTD_strategy ZVar14;
  int iVar15;
  ZSTD_paramSwitch_e ZVar16;
  ZSTD_paramSwitch_e ZVar17;
  size_t sVar18;
  undefined4 local_3c;
  undefined4 uStack_38;
  
  uVar1 = (params->cParams).searchLog;
  uVar5 = (params->cParams).windowLog;
  uVar6 = (params->cParams).chainLog;
  uVar7 = (params->cParams).hashLog;
  cParams.hashLog = uVar7;
  cParams.chainLog = uVar6;
  cParams.windowLog = uVar5;
  uVar2 = (params->cParams).minMatch;
  uVar3 = (params->cParams).targetLength;
  uVar4 = (params->cParams).strategy;
  cParams.strategy = uVar4;
  cParams.targetLength = uVar3;
  cParams.searchLog = uVar1;
  cParams.minMatch = uVar2;
  sVar18 = ZSTD_checkCParams(cParams);
  if (sVar18 == 0) {
    memset(cctxParams,0,0xd0);
    uVar8 = (params->cParams).chainLog;
    uVar9 = (params->cParams).hashLog;
    uVar10 = (params->cParams).searchLog;
    uVar11 = (params->cParams).searchLog;
    uVar12 = (params->cParams).minMatch;
    uVar13 = (params->cParams).targetLength;
    ZVar14 = (params->cParams).strategy;
    (cctxParams->cParams).windowLog = (params->cParams).windowLog;
    (cctxParams->cParams).chainLog = uVar8;
    (cctxParams->cParams).hashLog = uVar9;
    (cctxParams->cParams).searchLog = uVar10;
    (cctxParams->cParams).searchLog = uVar11;
    (cctxParams->cParams).minMatch = uVar12;
    (cctxParams->cParams).targetLength = uVar13;
    (cctxParams->cParams).strategy = ZVar14;
    iVar15 = (params->fParams).checksumFlag;
    (cctxParams->fParams).contentSizeFlag = (params->fParams).contentSizeFlag;
    (cctxParams->fParams).checksumFlag = iVar15;
    (cctxParams->fParams).noDictIDFlag = (params->fParams).noDictIDFlag;
    cctxParams->compressionLevel = compressionLevel;
    ZVar16 = ZSTD_resolveRowMatchFinderMode(ZSTD_ps_auto,&params->cParams);
    cctxParams->useRowMatchFinder = ZVar16;
    ZVar17 = ZSTD_ps_disable;
    ZVar16 = ZVar17;
    if (ZSTD_btlazy2 < (params->cParams).strategy) {
      ZVar16 = ((params->cParams).windowLog < 0x11) + ZSTD_ps_enable;
    }
    cctxParams->useBlockSplitter = ZVar16;
    if (ZSTD_btlazy2 < (params->cParams).strategy) {
      ZVar17 = ((params->cParams).windowLog < 0x1b) + ZSTD_ps_enable;
    }
    (cctxParams->ldmParams).enableLdm = ZVar17;
    cctxParams->maxBlockSize = 0x20000;
    cctxParams->searchForExternalRepcodes = (compressionLevel < 10) + ZSTD_ps_enable;
    return;
  }
  __assert_fail("!ZSTD_checkCParams(params->cParams)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                ,0x17f,
                "void ZSTD_CCtxParams_init_internal(ZSTD_CCtx_params *, const ZSTD_parameters *, int)"
               );
}

Assistant:

static void
ZSTD_CCtxParams_init_internal(ZSTD_CCtx_params* cctxParams,
                        const ZSTD_parameters* params,
                              int compressionLevel)
{
    assert(!ZSTD_checkCParams(params->cParams));
    ZSTD_memset(cctxParams, 0, sizeof(*cctxParams));
    cctxParams->cParams = params->cParams;
    cctxParams->fParams = params->fParams;
    /* Should not matter, as all cParams are presumed properly defined.
     * But, set it for tracing anyway.
     */
    cctxParams->compressionLevel = compressionLevel;
    cctxParams->useRowMatchFinder = ZSTD_resolveRowMatchFinderMode(cctxParams->useRowMatchFinder, &params->cParams);
    cctxParams->useBlockSplitter = ZSTD_resolveBlockSplitterMode(cctxParams->useBlockSplitter, &params->cParams);
    cctxParams->ldmParams.enableLdm = ZSTD_resolveEnableLdm(cctxParams->ldmParams.enableLdm, &params->cParams);
    cctxParams->validateSequences = ZSTD_resolveExternalSequenceValidation(cctxParams->validateSequences);
    cctxParams->maxBlockSize = ZSTD_resolveMaxBlockSize(cctxParams->maxBlockSize);
    cctxParams->searchForExternalRepcodes = ZSTD_resolveExternalRepcodeSearch(cctxParams->searchForExternalRepcodes, compressionLevel);
    DEBUGLOG(4, "ZSTD_CCtxParams_init_internal: useRowMatchFinder=%d, useBlockSplitter=%d ldm=%d",
                cctxParams->useRowMatchFinder, cctxParams->useBlockSplitter, cctxParams->ldmParams.enableLdm);
}